

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_1::WatWriter::WriteVar(WatWriter *this,Var *var,NextChar next_char)

{
  bool bVar1;
  char *pcVar2;
  string *str;
  int __c;
  string_view local_30;
  NextChar local_1c;
  Var *pVStack_18;
  NextChar next_char_local;
  Var *var_local;
  WatWriter *this_local;
  
  local_1c = next_char;
  pVStack_18 = var;
  var_local = (Var *)this;
  bVar1 = Var::is_index(var);
  if (bVar1) {
    pcVar2 = Var::index(pVStack_18,(char *)var,__c);
    Writef(this,"%u",(ulong)pcVar2 & 0xffffffff);
    this->next_char_ = local_1c;
  }
  else {
    str = Var::name_abi_cxx11_(pVStack_18);
    string_view::string_view(&local_30,str);
    WriteName(this,local_30,local_1c);
  }
  return;
}

Assistant:

void WatWriter::WriteVar(const Var& var, NextChar next_char) {
  if (var.is_index()) {
    Writef("%" PRIindex, var.index());
    next_char_ = next_char;
  } else {
    WriteName(var.name(), next_char);
  }
}